

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

void __thiscall RtApi::tickStreamTime(RtApi *this)

{
  (this->stream_).streamTime =
       (double)(this->stream_).bufferSize / (double)(this->stream_).sampleRate +
       (this->stream_).streamTime;
  return;
}

Assistant:

void RtApi :: tickStreamTime( void )
{
  // Subclasses that do not provide their own implementation of
  // getStreamTime should call this function once per buffer I/O to
  // provide basic stream time support.

  stream_.streamTime += ( stream_.bufferSize * 1.0 / stream_.sampleRate );

  /*
#if defined( HAVE_GETTIMEOFDAY )
  gettimeofday( &stream_.lastTickTimestamp, NULL );
#endif
  */
}